

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void __thiscall
perfetto::protos::gen::TraceConfig_ProducerConfig::~TraceConfig_ProducerConfig
          (TraceConfig_ProducerConfig *this)

{
  (this->super_CppMessageObj)._vptr_CppMessageObj =
       (_func_int **)&PTR__TraceConfig_ProducerConfig_00407c30;
  ::std::__cxx11::string::~string((string *)&this->unknown_fields_);
  ::std::__cxx11::string::~string((string *)&this->producer_name_);
  return;
}

Assistant:

TraceConfig_ProducerConfig::~TraceConfig_ProducerConfig() = default;